

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

optional<wallet::SelectionResult> *
wallet::coinselector_tests::KnapsackSolver
          (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng)

{
  long lVar1;
  bool bVar2;
  T *__t;
  optional<wallet::SelectionResult> *in_RDI;
  long in_FS_OFFSET;
  Result<wallet::SelectionResult> res;
  Result<wallet::SelectionResult> *in_stack_ffffffffffffff28;
  optional<wallet::SelectionResult> *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  wallet::KnapsackSolver
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._48_8_,
             (CAmount *)
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._40_8_,
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._32_8_,
             (FastRandomContext *)
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._24_8_,
             res.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._20_4_);
  bVar2 = util::Result::operator_cast_to_bool(in_stack_ffffffffffffff28);
  if (bVar2) {
    __t = util::Result<wallet::SelectionResult>::operator*(in_stack_ffffffffffffff28);
    std::optional<wallet::SelectionResult>::optional<wallet::SelectionResult_&,_true>(this,__t);
  }
  else {
    std::optional<wallet::SelectionResult>::optional(this);
  }
  util::Result<wallet::SelectionResult>::~Result(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                              CAmount change_target, FastRandomContext& rng)
{
    auto res{KnapsackSolver(groups, nTargetValue, change_target, rng, MAX_STANDARD_TX_WEIGHT)};
    return res ? std::optional<SelectionResult>(*res) : std::nullopt;
}